

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree.hpp
# Opt level: O3

vector<P_*,_std::allocator<P_*>_> * __thiscall
kdtree::KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less>::queryRectangle
          (vector<P_*,_std::allocator<P_*>_> *__return_storage_ptr__,
          KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less> *this,Node *node,P *searchMin,P *searchMax,
          P *currentRegionMin,P *currentRegionMax,uint depth)

{
  pointer *pppPVar1;
  double dVar2;
  int iVar3;
  iterator __position;
  bool bVar4;
  P *regionMin;
  P *regionMax;
  P *regionMin_00;
  undefined1 local_78 [8];
  vector<P_*,_std::allocator<P_*>_> resultLeft;
  
  (__return_storage_ptr__->super__Vector_base<P_*,_std::allocator<P_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<P_*,_std::allocator<P_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<P_*,_std::allocator<P_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (node->left == (Node *)0x0) {
    bVar4 = nodeInSearchRange(this,searchMin,searchMax,node);
    if (bVar4) {
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<P_*,_std::allocator<P_*>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<P_*,_std::allocator<P_*>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<P*,std::allocator<P*>>::_M_realloc_insert<P*const&>
                  ((vector<P*,std::allocator<P*>> *)__return_storage_ptr__,__position,&node->value);
      }
      else {
        *__position._M_current = node->value;
        pppPVar1 = &(__return_storage_ptr__->super__Vector_base<P_*,_std::allocator<P_*>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppPVar1 = *pppPVar1 + 1;
      }
    }
  }
  else {
    regionMin = P_new::operator()((P_new *)local_78);
    regionMax = P_new::operator()((P_new *)local_78);
    regionMin_00 = P_new::operator()((P_new *)local_78);
    resultLeft.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)P_new::operator()((P_new *)local_78);
    regionMin->d0 = currentRegionMin->d0;
    regionMax->d0 = currentRegionMax->d0;
    regionMin_00->d0 = currentRegionMin->d0;
    ((P *)resultLeft.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage)->d0 = currentRegionMax->d0;
    regionMin->d1 = currentRegionMin->d1;
    regionMax->d1 = currentRegionMax->d1;
    regionMin_00->d1 = currentRegionMin->d1;
    ((P *)resultLeft.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage)->d1 = currentRegionMax->d1;
    std::__cxx11::string::_M_assign((string *)&regionMin->d2);
    std::__cxx11::string::_M_assign((string *)&regionMax->d2);
    std::__cxx11::string::_M_assign((string *)&regionMin_00->d2);
    std::__cxx11::string::_M_assign
              ((string *)
               (resultLeft.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 2));
    if (depth % 3 == 0) {
      iVar3 = node->value->d0;
      regionMax->d0 = iVar3;
      regionMin_00->d0 = iVar3;
    }
    else if (depth % 3 == 1) {
      dVar2 = node->value->d1;
      regionMax->d1 = dVar2;
      regionMin_00->d1 = dVar2;
    }
    else {
      std::__cxx11::string::_M_assign((string *)&regionMax->d2);
      std::__cxx11::string::_M_assign((string *)&regionMin_00->d2);
    }
    bVar4 = regionContained(this,searchMin,searchMax,regionMin,regionMax);
    if (bVar4) {
      reportSubtree(this,node->left,__return_storage_ptr__);
    }
    else {
      bVar4 = regionIntersects(this,searchMin,searchMax,regionMin,regionMax);
      if (bVar4) {
        queryRectangle((vector<P_*,_std::allocator<P_*>_> *)local_78,this,node->left,searchMin,
                       searchMax,regionMin,regionMax,depth + 1);
        std::vector<P*,std::allocator<P*>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<P**,std::vector<P*,std::allocator<P*>>>>
                  ((vector<P*,std::allocator<P*>> *)__return_storage_ptr__,
                   (__return_storage_ptr__->super__Vector_base<P_*,_std::allocator<P_*>_>)._M_impl.
                   super__Vector_impl_data._M_finish,local_78,
                   resultLeft.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.
                   super__Vector_impl_data._M_start);
        if (local_78 != (undefined1  [8])0x0) {
          operator_delete((void *)local_78);
        }
      }
    }
    bVar4 = regionContained(this,searchMin,searchMax,regionMin_00,
                            (P *)resultLeft.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage);
    if (bVar4) {
      reportSubtree(this,node->right,__return_storage_ptr__);
    }
    else {
      bVar4 = regionIntersects(this,searchMin,searchMax,regionMin_00,
                               (P *)resultLeft.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl
                                    .super__Vector_impl_data._M_end_of_storage);
      if (bVar4) {
        queryRectangle((vector<P_*,_std::allocator<P_*>_> *)local_78,this,node->right,searchMin,
                       searchMax,regionMin_00,
                       (P *)resultLeft.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,depth + 1);
        std::vector<P*,std::allocator<P*>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<P**,std::vector<P*,std::allocator<P*>>>>
                  ((vector<P*,std::allocator<P*>> *)__return_storage_ptr__,
                   (__return_storage_ptr__->super__Vector_base<P_*,_std::allocator<P_*>_>)._M_impl.
                   super__Vector_impl_data._M_finish,local_78,
                   resultLeft.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.
                   super__Vector_impl_data._M_start);
        if (local_78 != (undefined1  [8])0x0) {
          operator_delete((void *)local_78);
        }
      }
    }
    P_delete::operator()((P_delete *)local_78,regionMin);
    P_delete::operator()((P_delete *)local_78,regionMax);
    P_delete::operator()((P_delete *)local_78,regionMin_00);
    P_delete::operator()
              ((P_delete *)local_78,
               (P *)resultLeft.super__Vector_base<P_*,_std::allocator<P_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T*> queryRectangle(Node * const node, T * const searchMin, T * const searchMax, T * const currentRegionMin, T * const currentRegionMax, const unsigned int depth) const {
			std::vector<T*> result;

			// if node->left == nullptr then also node->right == nullptr.
			// this means we reached a leaf of the tree
			if (node->left == nullptr) {
				// if the leaf is within the search range, add it to the result vector
				if (nodeInSearchRange(searchMin, searchMax, node)) {
					result.push_back(node->value);
				}
			}
			else {
				T *leftRegionMin = NEW()();
				T *leftRegionMax = NEW()();
				T *rightRegionMin = NEW()();
				T *rightRegionMax = NEW()();

				for (int i = 0; i < dim; i++) {
					SET()(leftRegionMin, currentRegionMin, i);
					SET()(leftRegionMax, currentRegionMax, i);
					SET()(rightRegionMin, currentRegionMin, i);
					SET()(rightRegionMax, currentRegionMax, i);
				}

				SET()(leftRegionMax, node->value, depth%dim);
				SET()(rightRegionMin, node->value, depth%dim);

				if (regionContained(searchMin, searchMax, leftRegionMin, leftRegionMax)) {
					reportSubtree(node->left, &result);
				}
				else {
					if (regionIntersects(searchMin, searchMax, leftRegionMin, leftRegionMax)) {
						std::vector<T*> resultLeft = queryRectangle(node->left, searchMin, searchMax, leftRegionMin, leftRegionMax, depth + 1);
						result.insert(result.end(), resultLeft.begin(), resultLeft.end());
					}
				}

				if (regionContained(searchMin, searchMax, rightRegionMin, rightRegionMax)) {
					reportSubtree(node->right, &result);
				}
				else {
					if (regionIntersects(searchMin, searchMax, rightRegionMin, rightRegionMax)) {
						std::vector<T*> resultRight = queryRectangle(node->right, searchMin, searchMax, rightRegionMin, rightRegionMax, depth + 1);
						result.insert(result.end(), resultRight.begin(), resultRight.end());
					}
				}

				DELETE()(leftRegionMin);
				DELETE()(leftRegionMax);
				DELETE()(rightRegionMin);
				DELETE()(rightRegionMax);
			}
			return result;
		}